

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O0

void Handlers::Guild_Buy(Character *character,PacketReader *reader)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  uint *puVar7;
  undefined1 local_b0 [8];
  PacketBuilder reply;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  int local_20;
  uint local_1c;
  int max_deposit;
  int gold;
  PacketReader *reader_local;
  Character *character_local;
  
  if (((character->trading & 1U) == 0) &&
     (_max_deposit = reader, reader_local = (PacketReader *)character,
     bVar3 = Character::CanInteractItems(character), bVar3)) {
    PacketReader::GetInt(_max_deposit);
    local_1c = PacketReader::GetInt(_max_deposit);
    if ((-1 < (int)local_1c) &&
       (((int)reader_local[0xb].pos == 0xb &&
        (bVar3 = std::__shared_ptr::operator_cast_to_bool
                           ((__shared_ptr *)reader_local[0x1a].data.field_2._M_local_buf), bVar3))))
    {
      lVar2 = *(long *)&reader_local[0x1a].data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"GuildBankMax",&local_41);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)(lVar2 + 0x198),&local_40);
      iVar4 = util::variant::operator_cast_to_int(pmVar5);
      peVar6 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          reader_local[0x1a].data.field_2._M_local_buf);
      iVar4 = iVar4 - peVar6->bank;
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      if (0 < iVar4) {
        local_20 = iVar4;
        puVar7 = (uint *)std::min<int>((int *)&local_1c,&local_20);
        uVar1 = *puVar7;
        lVar2 = *(long *)&reader_local[0x1a].data;
        local_1c = uVar1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"GuildMinDeposit",
                   (allocator<char> *)((long)&reply.add_size + 7));
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)(lVar2 + 0x198),&local_78);
        iVar4 = util::variant::operator_cast_to_int(pmVar5);
        bVar3 = false;
        if (iVar4 <= (int)uVar1) {
          iVar4 = Character::HasItem((Character *)reader_local,1,false);
          bVar3 = (int)local_1c <= iVar4;
        }
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)((long)&reply.add_size + 7));
        if (bVar3) {
          Character::DelItem((Character *)reader_local,1,local_1c);
          peVar6 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)reader_local[0x1a].data.field_2._M_local_buf);
          Guild::AddBank(peVar6,local_1c);
          PacketBuilder::PacketBuilder((PacketBuilder *)local_b0,PACKET_GUILD,PACKET_BUY,4);
          iVar4 = Character::HasItem((Character *)reader_local,1,false);
          PacketBuilder::AddInt((PacketBuilder *)local_b0,iVar4);
          Character::Send((Character *)reader_local,(PacketBuilder *)local_b0);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_b0);
        }
      }
    }
  }
  return;
}

Assistant:

void Guild_Buy(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int session = */reader.GetInt();
	int gold = reader.GetInt();

	if (gold < 0)
		return;

	if (character->npc_type == ENF::Guild)
	{
		if (character->guild)
		{
			int max_deposit = int(character->world->config["GuildBankMax"]) - character->guild->bank;

			if (max_deposit <= 0)
				return;

			gold = std::min(gold, max_deposit);

			if (gold >= static_cast<int>(character->world->config["GuildMinDeposit"]) && character->HasItem(1) >= gold)
			{
				character->DelItem(1, gold);
				character->guild->AddBank(gold);

				PacketBuilder reply(PACKET_GUILD, PACKET_BUY, 4);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);
			}
		}
	}
}